

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict pre_cond_expr(c2m_ctx_t c2m_ctx)

{
  int iVar1;
  node_t_conflict pnVar2;
  node_t_conflict pnVar3;
  pos_t pos;
  pos_t local_28;
  
  pnVar2 = pre_left_op(c2m_ctx,0x10b,-1,pre_land_expr);
  if (pnVar2 != (node_t_conflict)0x0) {
    iVar1 = pre_match((c2m_ctx_t)c2m_ctx->pre_ctx,0x3f,&local_28,(node_code_t *)0x0,
                      (node_t_conflict *)0x0);
    if (iVar1 == 0) {
      return pnVar2;
    }
    pnVar2 = new_pos_node1(c2m_ctx,N_COND,local_28,pnVar2);
    pnVar3 = pre_cond_expr(c2m_ctx);
    if (pnVar3 != (node_t_conflict)0x0) {
      op_append(c2m_ctx,pnVar2,pnVar3);
      iVar1 = pre_match((c2m_ctx_t)c2m_ctx->pre_ctx,0x3a,(pos_t *)0x0,(node_code_t *)0x0,
                        (node_t_conflict *)0x0);
      if (iVar1 == 0) {
        return (node_t_conflict)0x0;
      }
      pnVar3 = pre_cond_expr(c2m_ctx);
      if (pnVar3 != (node_t_conflict)0x0) {
        op_append(c2m_ctx,pnVar2,pnVar3);
        return pnVar2;
      }
    }
  }
  return (node_t_conflict)0x0;
}

Assistant:

static node_t pre_cond_expr (c2m_ctx_t c2m_ctx) {
  node_t r, n;
  pos_t pos;

  if ((r = pre_lor_expr (c2m_ctx)) == NULL) return r;
  if (!pre_match (c2m_ctx, '?', &pos, NULL, NULL)) return r;
  n = new_pos_node1 (c2m_ctx, N_COND, pos, r);
  if ((r = pre_cond_expr (c2m_ctx)) == NULL) return r;
  op_append (c2m_ctx, n, r);
  if (!pre_match (c2m_ctx, ':', NULL, NULL, NULL)) return NULL;
  if ((r = pre_cond_expr (c2m_ctx)) == NULL) return r;
  op_append (c2m_ctx, n, r);
  return n;
}